

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int diamond_search_sad(FULLPEL_MV start_mv,uint start_mv_sad,FULLPEL_MOTION_SEARCH_PARAMS *ms_params
                      ,int search_step,int *num00,FULLPEL_MV *best_mv,FULLPEL_MV *second_best_mv)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  FULLPEL_MV FVar4;
  buf_2d *pbVar5;
  buf_2d *pbVar6;
  search_site_config *psVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  short sVar11;
  short sVar12;
  bool bVar13;
  long lVar14;
  int j;
  uint uVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint8_t *puVar21;
  ulong uVar22;
  int *piVar23;
  ulong uVar24;
  uint uVar25;
  uint8_t *puVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  search_site *psVar30;
  short sVar31;
  FULLPEL_MV FVar32;
  FULLPEL_MV FVar33;
  short sVar35;
  undefined1 auVar34 [16];
  FULLPEL_MV local_fc;
  uint sads [4];
  uchar *block_offset [4];
  
  pbVar5 = (ms_params->ms_buffers).ref;
  pbVar6 = (ms_params->ms_buffers).src;
  psVar7 = ms_params->search_sites;
  iVar20 = psVar7->num_search_steps;
  if (second_best_mv != (FULLPEL_MV *)0x0) {
    local_fc = *second_best_mv;
  }
  puVar8 = pbVar6->buf;
  iVar2 = pbVar6->stride;
  iVar3 = pbVar5->stride;
  *best_mv = start_mv;
  uVar25 = iVar20 - search_step;
  uVar22 = (ulong)uVar25;
  puVar26 = pbVar5->buf + (((int)start_mv >> 0x10) + (int)start_mv.row * pbVar5->stride);
  if ((ms_params->ms_buffers).second_pred == (uint8_t *)0x0) {
    if (0 < (int)uVar25) {
      bVar13 = false;
      iVar20 = 0;
      do {
        iVar27 = (int)uVar22;
        uVar22 = (ulong)(iVar27 - 1);
        uVar25 = psVar7->searches_per_step[uVar22];
        if (((((int)psVar7->site[uVar22][1].mv.row + (int)best_mv->row <
               (ms_params->mv_limits).row_min) ||
             ((ms_params->mv_limits).row_max <
              (int)psVar7->site[uVar22][2].mv.row + (int)best_mv->row)) ||
            ((int)psVar7->site[uVar22][3].mv.col + (int)best_mv->col <
             (ms_params->mv_limits).col_min)) ||
           ((ms_params->mv_limits).col_max < (int)psVar7->site[uVar22][4].mv.col + (int)best_mv->col
           )) {
          if ((int)uVar25 < 1) goto LAB_001e0272;
          uVar29 = 0;
          uVar24 = 1;
          do {
            FVar4 = psVar7->site[uVar22][uVar24].mv;
            sVar31 = FVar4.row + (*best_mv).row;
            sVar35 = FVar4.col + (*best_mv).col;
            if ((((ms_params->mv_limits).col_min <= (int)sVar35) &&
                ((int)sVar35 <= (ms_params->mv_limits).col_max)) &&
               (((ms_params->mv_limits).row_min <= (int)sVar31 &&
                (((int)sVar31 <= (ms_params->mv_limits).row_max &&
                 (uVar15 = (*ms_params->sdf)(pbVar6->buf,pbVar6->stride,
                                             puVar26 + psVar7->site[uVar22][uVar24].offset,iVar3),
                 uVar15 < start_mv_sad)))))) {
              bVar1 = (ms_params->mv_cost_params).mv_cost_type;
              if (bVar1 < 4) {
                FVar4 = (ms_params->mv_cost_params).full_ref_mv;
                auVar34 = psllw(ZEXT416(CONCAT22(sVar35 - FVar4.col,sVar31 - FVar4.row)),3);
                sVar31 = auVar34._0_2_;
                sVar35 = auVar34._2_2_;
                switch(bVar1) {
                case 0:
                  uVar18 = ((ms_params->mv_cost_params).mvcost[0][sVar31] +
                            *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                    (ulong)((uint)(sVar35 != 0) * 4 + (uint)(sVar31 != 0) * 8)) +
                           (ms_params->mv_cost_params).mvcost[1][sVar35]) *
                           (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
                  break;
                case 1:
                  sVar11 = -sVar31;
                  sVar12 = -sVar35;
                  uVar18 = ((uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                          (ushort)(sVar12 >= sVar35) * sVar12) +
                           (uint)(ushort)((ushort)(sVar11 < sVar31) * sVar31 |
                                         (ushort)(sVar11 >= sVar31) * sVar11)) * 4;
                  break;
                case 2:
                  sVar11 = -sVar31;
                  sVar12 = -sVar35;
                  uVar18 = ((uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                          (ushort)(sVar12 >= sVar35) * sVar12) +
                           (uint)(ushort)((ushort)(sVar11 < sVar31) * sVar31 |
                                         (ushort)(sVar11 >= sVar31) * sVar11)) * 0xf >> 3;
                  break;
                case 3:
                  sVar11 = -sVar31;
                  sVar12 = -sVar35;
                  uVar18 = (uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                         (ushort)(sVar12 >= sVar35) * sVar12) +
                           (uint)(ushort)((ushort)(sVar11 < sVar31) * sVar31 |
                                         (ushort)(sVar11 >= sVar31) * sVar11);
                }
              }
              else {
                uVar18 = 0;
              }
              if (uVar18 + uVar15 < start_mv_sad) {
                uVar29 = uVar24 & 0xffffffff;
                start_mv_sad = uVar18 + uVar15;
              }
            }
            iVar28 = (int)uVar29;
            uVar24 = uVar24 + 1;
          } while ((ulong)uVar25 + 1 != uVar24);
        }
        else if ((int)uVar25 < 1) {
LAB_001e0272:
          iVar28 = 0;
        }
        else {
          piVar23 = &psVar7->site[uVar22][1].offset;
          psVar30 = psVar7->site[uVar22] + 1;
          iVar16 = 1;
          iVar19 = 0;
          iVar28 = 0;
          do {
            lVar17 = 0;
            do {
              block_offset[lVar17] = puVar26 + piVar23[lVar17 * 2];
              lVar17 = lVar17 + 1;
            } while (lVar17 != 4);
            (*ms_params->sdx4df)(puVar8,iVar2,block_offset,iVar3,sads);
            lVar17 = 0;
            do {
              if (sads[lVar17] < start_mv_sad) {
                bVar1 = (ms_params->mv_cost_params).mv_cost_type;
                if (bVar1 < 4) {
                  FVar4 = (ms_params->mv_cost_params).full_ref_mv;
                  auVar34 = psllw(ZEXT416(CONCAT22((psVar30[lVar17].mv.col + (*best_mv).col) -
                                                   FVar4.col,
                                                   (psVar30[lVar17].mv.row + (*best_mv).row) -
                                                   FVar4.row)),3);
                  sVar31 = auVar34._0_2_;
                  sVar35 = auVar34._2_2_;
                  switch(bVar1) {
                  case 0:
                    uVar15 = ((ms_params->mv_cost_params).mvcost[0][sVar31] +
                              *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                      (ulong)((uint)(sVar35 != 0) * 4 + (uint)(sVar31 != 0) * 8)) +
                             (ms_params->mv_cost_params).mvcost[1][sVar35]) *
                             (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
                    break;
                  case 1:
                    sVar11 = -sVar31;
                    sVar12 = -sVar35;
                    uVar15 = ((uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                            (ushort)(sVar12 >= sVar35) * sVar12) +
                             (uint)(ushort)((ushort)(sVar11 < sVar31) * sVar31 |
                                           (ushort)(sVar11 >= sVar31) * sVar11)) * 4;
                    break;
                  case 2:
                    sVar11 = -sVar31;
                    sVar12 = -sVar35;
                    uVar15 = ((uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                            (ushort)(sVar12 >= sVar35) * sVar12) +
                             (uint)(ushort)((ushort)(sVar11 < sVar31) * sVar31 |
                                           (ushort)(sVar11 >= sVar31) * sVar11)) * 0xf >> 3;
                    break;
                  case 3:
                    sVar11 = -sVar31;
                    sVar12 = -sVar35;
                    uVar15 = (uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                           (ushort)(sVar12 >= sVar35) * sVar12) +
                             (uint)(ushort)((ushort)(sVar11 < sVar31) * sVar31 |
                                           (ushort)(sVar11 >= sVar31) * sVar11);
                  }
                }
                else {
                  uVar15 = 0;
                }
                uVar15 = uVar15 + sads[lVar17];
                if (uVar15 < start_mv_sad) {
                  iVar28 = (int)lVar17 + iVar19 + 1;
                  start_mv_sad = uVar15;
                }
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 != 4);
            iVar16 = iVar16 + 4;
            piVar23 = piVar23 + 8;
            iVar19 = iVar19 + 4;
            psVar30 = psVar30 + 4;
          } while (iVar16 <= (int)uVar25);
        }
        if (iVar28 != 0) {
          local_fc = *best_mv;
          FVar4 = psVar7->site[uVar22][iVar28].mv;
          FVar33.row = local_fc.row + FVar4.row;
          FVar33.col = local_fc.col + FVar4.col;
          *best_mv = FVar33;
          puVar26 = puVar26 + psVar7->site[uVar22][iVar28].offset;
          bVar13 = true;
        }
        iVar20 = iVar20 + (uint)!bVar13;
        if (((3 < iVar27) && (iVar28 == 0)) &&
           (uVar24 = uVar22, psVar7->radius[iVar27 - 2] == psVar7->radius[uVar22])) {
          do {
            iVar20 = iVar20 + 1;
            uVar22 = uVar24 - 1;
            if ((long)uVar24 < 4) break;
            lVar17 = uVar24 + 0x15;
            lVar14 = uVar24 + 0x14;
            uVar24 = uVar22;
          } while (psVar7->searches_per_step[lVar14] == psVar7->searches_per_step[lVar17]);
        }
      } while (0 < (int)uVar22);
      goto LAB_001e032e;
    }
  }
  else if (0 < (int)uVar25) {
    bVar13 = false;
    iVar20 = 0;
    do {
      iVar2 = (int)uVar22;
      uVar22 = (ulong)(iVar2 - 1);
      uVar25 = psVar7->searches_per_step[uVar22];
      if ((int)uVar25 < 1) {
        iVar27 = 0;
      }
      else {
        uVar24 = 0;
        uVar29 = 1;
        do {
          FVar4 = psVar7->site[uVar22][uVar29].mv;
          sVar31 = FVar4.row + (*best_mv).row;
          sVar35 = FVar4.col + (*best_mv).col;
          if ((((ms_params->mv_limits).col_min <= (int)sVar35) &&
              ((int)sVar35 <= (ms_params->mv_limits).col_max)) &&
             (((ms_params->mv_limits).row_min <= (int)sVar31 &&
              ((int)sVar31 <= (ms_params->mv_limits).row_max)))) {
            puVar21 = puVar26 + psVar7->site[uVar22][uVar29].offset;
            puVar8 = (ms_params->ms_buffers).second_pred;
            puVar9 = pbVar6->buf;
            iVar27 = pbVar6->stride;
            puVar10 = (ms_params->ms_buffers).mask;
            if (puVar10 == (uint8_t *)0x0) {
              if (puVar8 == (uint8_t *)0x0) {
                uVar15 = (*ms_params->sdf)(puVar9,iVar27,puVar21,iVar3);
              }
              else {
                uVar15 = (*ms_params->vfp->sdaf)(puVar9,iVar27,puVar21,iVar3,puVar8);
              }
            }
            else {
              uVar15 = (*ms_params->vfp->msdf)
                                 (puVar9,iVar27,puVar21,iVar3,puVar8,puVar10,
                                  (ms_params->ms_buffers).mask_stride,
                                  (ms_params->ms_buffers).inv_mask);
            }
            if (uVar15 < start_mv_sad) {
              bVar1 = (ms_params->mv_cost_params).mv_cost_type;
              if (bVar1 < 4) {
                FVar4 = (ms_params->mv_cost_params).full_ref_mv;
                auVar34 = psllw(ZEXT416(CONCAT22(sVar35 - FVar4.col,sVar31 - FVar4.row)),3);
                sVar31 = auVar34._0_2_;
                sVar35 = auVar34._2_2_;
                switch(bVar1) {
                case 0:
                  uVar18 = ((ms_params->mv_cost_params).mvcost[0][sVar31] +
                            *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                    (ulong)((uint)(sVar35 != 0) * 4 + (uint)(sVar31 != 0) * 8)) +
                           (ms_params->mv_cost_params).mvcost[1][sVar35]) *
                           (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
                  break;
                case 1:
                  sVar11 = -sVar31;
                  sVar12 = -sVar35;
                  uVar18 = ((uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                          (ushort)(sVar12 >= sVar35) * sVar12) +
                           (uint)(ushort)((ushort)(sVar11 < sVar31) * sVar31 |
                                         (ushort)(sVar11 >= sVar31) * sVar11)) * 4;
                  break;
                case 2:
                  sVar11 = -sVar31;
                  sVar12 = -sVar35;
                  uVar18 = ((uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                          (ushort)(sVar12 >= sVar35) * sVar12) +
                           (uint)(ushort)((ushort)(sVar11 < sVar31) * sVar31 |
                                         (ushort)(sVar11 >= sVar31) * sVar11)) * 0xf >> 3;
                  break;
                case 3:
                  sVar11 = -sVar31;
                  sVar12 = -sVar35;
                  uVar18 = (uint)(ushort)((ushort)(sVar12 < sVar35) * sVar35 |
                                         (ushort)(sVar12 >= sVar35) * sVar12) +
                           (uint)(ushort)((ushort)(sVar11 < sVar31) * sVar31 |
                                         (ushort)(sVar11 >= sVar31) * sVar11);
                }
              }
              else {
                uVar18 = 0;
              }
              if (uVar18 + uVar15 < start_mv_sad) {
                uVar24 = uVar29 & 0xffffffff;
                start_mv_sad = uVar18 + uVar15;
              }
            }
          }
          iVar27 = (int)uVar24;
          uVar29 = uVar29 + 1;
        } while ((ulong)uVar25 + 1 != uVar29);
      }
      if (iVar27 != 0) {
        local_fc = *best_mv;
        FVar4 = psVar7->site[uVar22][iVar27].mv;
        FVar32.row = local_fc.row + FVar4.row;
        FVar32.col = local_fc.col + FVar4.col;
        *best_mv = FVar32;
        puVar26 = puVar26 + psVar7->site[uVar22][iVar27].offset;
        bVar13 = true;
      }
      iVar20 = iVar20 + (uint)!bVar13;
      if (((3 < iVar2) && (iVar27 == 0)) &&
         (uVar24 = uVar22, psVar7->radius[iVar2 - 2] == psVar7->radius[uVar22])) {
        do {
          iVar20 = iVar20 + 1;
          uVar22 = uVar24 - 1;
          if ((long)uVar24 < 4) break;
          lVar17 = uVar24 + 0x15;
          lVar14 = uVar24 + 0x14;
          uVar24 = uVar22;
        } while (psVar7->searches_per_step[lVar14] == psVar7->searches_per_step[lVar17]);
      }
    } while (0 < (int)uVar22);
    goto LAB_001e032e;
  }
  iVar20 = 0;
LAB_001e032e:
  *num00 = iVar20;
  if (second_best_mv != (FULLPEL_MV *)0x0) {
    *second_best_mv = local_fc;
  }
  return (int)second_best_mv;
}

Assistant:

static int diamond_search_sad(FULLPEL_MV start_mv, unsigned int start_mv_sad,
                              const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                              const int search_step, int *num00,
                              FULLPEL_MV *best_mv, FULLPEL_MV *second_best_mv) {
#define UPDATE_SEARCH_STEP                                      \
  do {                                                          \
    if (best_site != 0) {                                       \
      tmp_second_best_mv = *best_mv;                            \
      best_mv->row += site[best_site].mv.row;                   \
      best_mv->col += site[best_site].mv.col;                   \
      best_address += site[best_site].offset;                   \
      is_off_center = 1;                                        \
    }                                                           \
                                                                \
    if (is_off_center == 0) num_center_steps++;                 \
                                                                \
    if (best_site == 0 && step > 2) {                           \
      int next_step_size = cfg->radius[step - 1];               \
      while (next_step_size == cfg->radius[step] && step > 2) { \
        num_center_steps++;                                     \
        --step;                                                 \
        next_step_size = cfg->radius[step - 1];                 \
      }                                                         \
    }                                                           \
  } while (0)

  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;

  const uint8_t *src_buf = src->buf;
  const int src_stride = src->stride;
  const int ref_stride = ref->stride;

  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;

  const search_site_config *cfg = ms_params->search_sites;

  int is_off_center = 0;
  // Number of times that we have stayed in the middle. This is used to skip
  // search steps in the future if diamond_search_sad is called again.
  int num_center_steps = 0;

  // search_step determines the length of the initial step and hence the number
  // of iterations.
  const int tot_steps = cfg->num_search_steps - search_step;
  FULLPEL_MV tmp_second_best_mv;
  if (second_best_mv) {
    tmp_second_best_mv = *second_best_mv;
  }

  *best_mv = start_mv;

  // Check the starting position
  const uint8_t *best_address = get_buf_from_fullmv(ref, &start_mv);
  unsigned int bestsad = start_mv_sad;

  // TODO(chiyotsai@google.com): Implement 4 points search for msdf&sdaf
  if (ms_params->ms_buffers.second_pred) {
    for (int step = tot_steps - 1; step >= 0; --step) {
      const search_site *site = cfg->site[step];
      const int num_searches = cfg->searches_per_step[step];
      int best_site = 0;

      for (int idx = 1; idx <= num_searches; idx++) {
        const FULLPEL_MV this_mv = { best_mv->row + site[idx].mv.row,
                                     best_mv->col + site[idx].mv.col };

        if (av1_is_fullmv_in_range(&ms_params->mv_limits, this_mv)) {
          const uint8_t *const check_here = site[idx].offset + best_address;
          unsigned int thissad =
              get_mvpred_compound_sad(ms_params, src, check_here, ref_stride);

          if (thissad < bestsad) {
            thissad += mvsad_err_cost_(&this_mv, mv_cost_params);
            if (thissad < bestsad) {
              bestsad = thissad;
              best_site = idx;
            }
          }
        }
      }
      UPDATE_SEARCH_STEP;
    }
  } else {
    for (int step = tot_steps - 1; step >= 0; --step) {
      const search_site *site = cfg->site[step];
      const int num_searches = cfg->searches_per_step[step];
      int best_site = 0;

      int all_in = 1;
      // Trap illegal vectors
      all_in &= best_mv->row + site[1].mv.row >= ms_params->mv_limits.row_min;
      all_in &= best_mv->row + site[2].mv.row <= ms_params->mv_limits.row_max;
      all_in &= best_mv->col + site[3].mv.col >= ms_params->mv_limits.col_min;
      all_in &= best_mv->col + site[4].mv.col <= ms_params->mv_limits.col_max;

      if (all_in) {
        for (int idx = 1; idx <= num_searches; idx += 4) {
          unsigned char const *block_offset[4];
          unsigned int sads[4];

          for (int j = 0; j < 4; j++)
            block_offset[j] = site[idx + j].offset + best_address;

          ms_params->sdx4df(src_buf, src_stride, block_offset, ref_stride,
                            sads);
          for (int j = 0; j < 4; j++) {
            if (sads[j] < bestsad) {
              const FULLPEL_MV this_mv = { best_mv->row + site[idx + j].mv.row,
                                           best_mv->col +
                                               site[idx + j].mv.col };
              unsigned int thissad =
                  sads[j] + mvsad_err_cost_(&this_mv, mv_cost_params);
              if (thissad < bestsad) {
                bestsad = thissad;
                best_site = idx + j;
              }
            }
          }
        }
      } else {
        for (int idx = 1; idx <= num_searches; idx++) {
          const FULLPEL_MV this_mv = { best_mv->row + site[idx].mv.row,
                                       best_mv->col + site[idx].mv.col };

          if (av1_is_fullmv_in_range(&ms_params->mv_limits, this_mv)) {
            const uint8_t *const check_here = site[idx].offset + best_address;
            unsigned int thissad =
                get_mvpred_sad(ms_params, src, check_here, ref_stride);

            if (thissad < bestsad) {
              thissad += mvsad_err_cost_(&this_mv, mv_cost_params);
              if (thissad < bestsad) {
                bestsad = thissad;
                best_site = idx;
              }
            }
          }
        }
      }
      UPDATE_SEARCH_STEP;
    }
  }

  *num00 = num_center_steps;
  if (second_best_mv) {
    *second_best_mv = tmp_second_best_mv;
  }

  return bestsad;

#undef UPDATE_SEARCH_STEP
}